

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::HasLineBreak(FunctionBody *this,charcount_t start,charcount_t end)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  char16 cVar4;
  LPCUTF8 puVar5;
  ulong uVar6;
  int iVar7;
  uint cchIndex;
  bool bVar8;
  DecodeOptions local_3c;
  byte *pbStack_38;
  DecodeOptions options;
  LPCUTF8 src;
  
  iVar7 = start - end;
  if (((start < end || iVar7 == 0) &&
      ((this->super_ParseableFunctionInfo).m_cchStartOffset <= start)) &&
     (end - start <= (this->super_ParseableFunctionInfo).m_cchLength)) {
    puVar5 = Utf8SourceInfo::GetSource
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr
                        ,L"FunctionBody::HasLineBreak");
    puVar5 = puVar5 + (this->super_ParseableFunctionInfo).m_cbStartOffset;
    uVar3 = (this->super_ParseableFunctionInfo).m_cbLength;
    cchIndex = start - (this->super_ParseableFunctionInfo).m_cchStartOffset;
    pbStack_38 = puVar5;
    if (uVar3 == (this->super_ParseableFunctionInfo).m_cchLength) {
      uVar6 = (ulong)cchIndex;
    }
    else {
      uVar6 = utf8::CharacterIndexToByteIndex
                        (puVar5,(ulong)uVar3,cchIndex,doAllowThreeByteSurrogates);
    }
    pbStack_38 = pbStack_38 + uVar6;
    local_3c = doAllowThreeByteSurrogates;
    bVar8 = end != start;
    if (bVar8) {
      do {
        if (pbStack_38 < puVar5 + uVar3) {
          pbVar1 = pbStack_38 + 1;
          bVar2 = *pbStack_38;
          cVar4 = (char16)bVar2;
          pbStack_38 = pbVar1;
          if ((char)bVar2 < '\0') {
            cVar4 = utf8::DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,puVar5 + uVar3,&local_3c
                                     ,(bool *)0x0);
          }
        }
        else {
          cVar4 = L'\0';
        }
        if ((ushort)cVar4 - 0x2028 < 2) {
          return bVar8;
        }
        if (cVar4 == L'\n') {
          return bVar8;
        }
        if (cVar4 == L'\r') {
          return bVar8;
        }
        iVar7 = iVar7 + 1;
        bVar8 = iVar7 != 0;
      } while (bVar8);
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool FunctionBody::HasLineBreak(charcount_t start, charcount_t end) const
    {
        if (start > end) return false;
        charcount_t cchLength = end - start;
        if (start < this->m_cchStartOffset || cchLength > this->m_cchLength) return false;
        LPCUTF8 src = this->GetSource(_u("FunctionBody::HasLineBreak"));
        LPCUTF8 last = src + this->LengthInBytes();
        size_t offset = this->LengthInBytes() == this->m_cchLength ?
            start - this->m_cchStartOffset :
            utf8::CharacterIndexToByteIndex(src, this->LengthInBytes(), start - this->m_cchStartOffset, utf8::doAllowThreeByteSurrogates);
        src = src + offset;

        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        for (charcount_t cch = cchLength; cch > 0; --cch)
        {
            switch (utf8::Decode(src, last, options))
            {
            case '\r':
            case '\n':
            case 0x2028:
            case 0x2029:
                return true;
            }
        }

        return false;
    }